

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall PlayerA::GetState(PlayerA *this)

{
  byte local_19;
  UINT8 finalState;
  PlayerA *this_local;
  
  if (this->_player == (PlayerBase *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_19 = this->_myPlayState;
    if (this->_fadeSmplStart != 0xffffffff) {
      local_19 = local_19 | 0x10;
    }
    this_local._7_1_ = local_19;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 PlayerA::GetState(void) const
{
	if (_player == NULL)
		return 0x00;
	UINT8 finalState = _myPlayState;
	if (_fadeSmplStart != (UINT32)-1)
		finalState |= PLAYSTATE_FADE;
	return finalState;
}